

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::setActivePanelHelper
          (QGraphicsScenePrivate *this,QGraphicsItem *item,bool duringActivationEvent)

{
  QGraphicsScene *this_00;
  long *plVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  GraphicsItemFlags GVar5;
  FocusPolicy FVar6;
  QGraphicsScene *pQVar7;
  QGraphicsItem *pQVar8;
  QGraphicsItem *pQVar9;
  QGraphicsItem *pQVar10;
  QGraphicsItem *pQVar11;
  QGraphicsScenePrivate *d;
  long lVar12;
  QGraphicsWidget *this_01;
  long in_FS_OFFSET;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScene **)&this->field_0x8;
  if (item == (QGraphicsItem *)0x0) {
    QGraphicsScene::setFocus(this_00,ActiveWindowFocusReason);
    pQVar8 = (QGraphicsItem *)0x0;
  }
  else {
    pQVar7 = (QGraphicsScene *)QGraphicsItem::scene(item);
    if (pQVar7 != this_00) {
      local_58.d._0_4_ = 2;
      local_58.size._4_4_ = 0;
      local_58.d._4_4_ = 0;
      local_58.ptr._0_4_ = 0;
      local_58.ptr._4_4_ = 0;
      local_58.size._0_4_ = 0;
      local_40 = "default";
      QMessageLogger::warning
                ((char *)&local_58,
                 "QGraphicsScene::setActivePanel: item %p must be part of this scene",item);
      goto LAB_005942bf;
    }
    QGraphicsScene::setFocus(this_00,ActiveWindowFocusReason);
    pQVar8 = QGraphicsItem::panel(item);
  }
  pQVar10 = this->activePanel;
  pQVar9 = pQVar10;
  if (pQVar8 == (QGraphicsItem *)0x0) {
    pQVar9 = (QGraphicsItem *)0x0;
  }
  this->lastActivePanel = pQVar9;
  if ((pQVar8 != pQVar10) && (0 < *(int *)(*(long *)(this_00 + 8) + 0x1b8) || duringActivationEvent)
     ) {
    pQVar9 = this->focusItem;
    if (pQVar10 == (QGraphicsItem *)0x0) {
      if (pQVar8 != (QGraphicsItem *)0x0 && !duringActivationEvent) {
        local_58.size._0_4_ = 0xaaaaaaaa;
        local_58.size._4_4_ = 0xaaaaaaaa;
        local_58.d._0_4_ = 0xaaaaaaaa;
        local_58.d._4_4_ = 0xaaaaaaaa;
        local_58.ptr._0_4_ = 0xaaaaaaaa;
        local_58.ptr._4_4_ = 0xaaaaaaaa;
        plVar1 = *(long **)(*(long *)(this_00 + 8) + 0x88);
        (**(code **)(*plVar1 + 0x60))(&local_58,plVar1,1);
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_68,WindowDeactivate);
        lVar2 = CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
        lVar3 = CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
        for (lVar12 = 0; lVar3 << 3 != lVar12; lVar12 = lVar12 + 8) {
          pQVar10 = *(QGraphicsItem **)(lVar2 + lVar12);
          bVar4 = QGraphicsItem::isVisible(pQVar10);
          if (((bVar4) && (bVar4 = QGraphicsItem::isPanel(pQVar10), !bVar4)) &&
             (pQVar11 = QGraphicsItem::parentItem(pQVar10), pQVar11 == (QGraphicsItem *)0x0)) {
            QGraphicsScene::sendEvent(this_00,pQVar10,(QEvent *)&local_68);
          }
        }
        QEvent::~QEvent((QEvent *)&local_68);
        QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
      }
    }
    else {
      pQVar10 = QGraphicsItem::focusItem(pQVar10);
      if ((pQVar10 != (QGraphicsItem *)0x0) &&
         (pQVar10 ==
          *(QGraphicsItem **)
           (*(long *)(this_00 + 8) + 0x188 +
           (ulong)(*(int *)(*(long *)(this_00 + 8) + 0x1b8) < 1) * 0x10))) {
        setFocusItemHelper(this,(QGraphicsItem *)0x0,ActiveWindowFocusReason,false);
      }
      local_58.d._0_4_ = 0xaaaaaaaa;
      local_58.d._4_4_ = 0xaaaaaaaa;
      local_58.ptr._0_4_ = 0xaaaaaaaa;
      local_58.ptr._4_4_ = 0xaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_58,WindowDeactivate);
      QGraphicsScene::sendEvent(this_00,this->activePanel,(QEvent *)&local_58);
      QEvent::~QEvent((QEvent *)&local_58);
    }
    this->activePanel = pQVar8;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_68,ActivationChange);
    QCoreApplication::sendEvent((QObject *)this_00,(QEvent *)&local_68);
    if (pQVar8 == (QGraphicsItem *)0x0) {
      if (0 < *(int *)(*(long *)(this_00 + 8) + 0x1b8)) {
        local_58.size._0_4_ = 0xaaaaaaaa;
        local_58.size._4_4_ = 0xaaaaaaaa;
        local_58.d._0_4_ = 0xaaaaaaaa;
        local_58.d._4_4_ = 0xaaaaaaaa;
        local_58.ptr._0_4_ = 0xaaaaaaaa;
        local_58.ptr._4_4_ = 0xaaaaaaaa;
        plVar1 = *(long **)(*(long *)(this_00 + 8) + 0x88);
        (**(code **)(*plVar1 + 0x60))(&local_58,plVar1,1);
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_78,WindowActivate);
        lVar2 = CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
        lVar3 = CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
        for (lVar12 = 0; lVar3 << 3 != lVar12; lVar12 = lVar12 + 8) {
          pQVar8 = *(QGraphicsItem **)(lVar2 + lVar12);
          bVar4 = QGraphicsItem::isVisible(pQVar8);
          if (((bVar4) && (bVar4 = QGraphicsItem::isPanel(pQVar8), !bVar4)) &&
             (pQVar10 = QGraphicsItem::parentItem(pQVar8), pQVar10 == (QGraphicsItem *)0x0)) {
            QGraphicsScene::sendEvent(this_00,pQVar8,(QEvent *)&local_78);
          }
        }
        QEvent::~QEvent((QEvent *)&local_78);
        QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
      }
    }
    else {
      local_58.d._0_4_ = 0xaaaaaaaa;
      local_58.d._4_4_ = 0xaaaaaaaa;
      local_58.ptr._0_4_ = 0xaaaaaaaa;
      local_58.ptr._4_4_ = 0xaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_58,WindowActivate);
      QGraphicsScene::sendEvent(this_00,pQVar8,(QEvent *)&local_58);
      pQVar10 = QGraphicsItem::focusItem(pQVar8);
      if ((pQVar10 == (QGraphicsItem *)0x0) &&
         (GVar5 = QGraphicsItem::flags(pQVar8), pQVar10 = pQVar8,
         ((uint)GVar5.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 4) == 0)) {
        bVar4 = QGraphicsItem::isWidget(pQVar8);
        if (bVar4) {
          this_01 = (QGraphicsWidget *)(pQVar8->d_ptr).d[1].needsRepaint.yp;
          do {
            FVar6 = QGraphicsWidget::focusPolicy(this_01);
            if ((FVar6 & TabFocus) != NoFocus) {
              pQVar10 = (QGraphicsItem *)(this_01 + 0x10);
              goto LAB_00594286;
            }
            this_01 = *(QGraphicsWidget **)(*(long *)(this_01 + 0x18) + 0x1c0);
            pQVar10 = (QGraphicsItem *)(this_01 + 0x10);
            if (this_01 == (QGraphicsWidget *)0x0) {
              pQVar10 = (QGraphicsItem *)0x0;
            }
          } while (pQVar10 != pQVar8);
        }
      }
      else {
LAB_00594286:
        setFocusItemHelper(this,pQVar10,ActiveWindowFocusReason,false);
      }
      QEvent::~QEvent((QEvent *)&local_58);
    }
    QGraphicsScene::focusItemChanged(this_00,this->focusItem,pQVar9,ActiveWindowFocusReason);
    QEvent::~QEvent((QEvent *)&local_68);
  }
LAB_005942bf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::setActivePanelHelper(QGraphicsItem *item, bool duringActivationEvent)
{
    Q_Q(QGraphicsScene);
    if (item && item->scene() != q) {
        qWarning("QGraphicsScene::setActivePanel: item %p must be part of this scene",
                 item);
        return;
    }

    // Ensure the scene has focus when we change panel activation.
    q->setFocus(Qt::ActiveWindowFocusReason);

    // Find the item's panel.
    QGraphicsItem *panel = item ? item->panel() : nullptr;
    lastActivePanel = panel ? activePanel : nullptr;
    if (panel == activePanel || (!q->isActive() && !duringActivationEvent))
        return;

    QGraphicsItem *oldFocusItem = focusItem;

    // Deactivate the last active panel.
    if (activePanel) {
        if (QGraphicsItem *fi = activePanel->focusItem()) {
            // Remove focus from the current focus item.
            if (fi == q->focusItem())
                setFocusItemHelper(nullptr, Qt::ActiveWindowFocusReason, /* emitFocusChanged = */ false);
        }

        QEvent event(QEvent::WindowDeactivate);
        q->sendEvent(activePanel, &event);
    } else if (panel && !duringActivationEvent) {
        // Deactivate the scene if changing activation to a panel.
        const auto items = q->items();
        QEvent event(QEvent::WindowDeactivate);
        for (QGraphicsItem *item : items) {
            if (item->isVisible() && !item->isPanel() && !item->parentItem())
                q->sendEvent(item, &event);
        }
    }

    // Update activate state.
    activePanel = panel;
    QEvent event(QEvent::ActivationChange);
    QCoreApplication::sendEvent(q, &event);

    // Activate
    if (panel) {
        QEvent event(QEvent::WindowActivate);
        q->sendEvent(panel, &event);

        // Set focus on the panel's focus item, or itself if it's
        // focusable, or on the first focusable item in the panel's
        // focus chain as a last resort.
        if (QGraphicsItem *focusItem = panel->focusItem()) {
            setFocusItemHelper(focusItem, Qt::ActiveWindowFocusReason, /* emitFocusChanged = */ false);
        } else if (panel->flags() & QGraphicsItem::ItemIsFocusable) {
            setFocusItemHelper(panel, Qt::ActiveWindowFocusReason, /* emitFocusChanged = */ false);
        } else if (panel->isWidget()) {
            QGraphicsWidget *fw = static_cast<QGraphicsWidget *>(panel)->d_func()->focusNext;
            do {
                if (fw->focusPolicy() & Qt::TabFocus) {
                    setFocusItemHelper(fw, Qt::ActiveWindowFocusReason, /* emitFocusChanged = */ false);
                    break;
                }
                fw = fw->d_func()->focusNext;
            } while (fw != panel);
        }
    } else if (q->isActive()) {
        const auto items = q->items();
        // Activate the scene
        QEvent event(QEvent::WindowActivate);
        for (QGraphicsItem *item : items) {
            if (item->isVisible() && !item->isPanel() && !item->parentItem())
                q->sendEvent(item, &event);
        }
    }

    emit q->focusItemChanged(focusItem, oldFocusItem, Qt::ActiveWindowFocusReason);
}